

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls.c
# Opt level: O1

int CVodeGetNonlinearSystemData
              (void *cvode_mem,sunrealtype *tcur,N_Vector *ypred,N_Vector *yn,N_Vector *fn,
              sunrealtype *gamma,sunrealtype *rl1,N_Vector *zn1,void **user_data)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0xb1,"CVodeGetNonlinearSystemData",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    *tcur = *(sunrealtype *)((long)cvode_mem + 0x408);
    *ypred = *(N_Vector *)((long)cvode_mem + 0x150);
    *yn = *(N_Vector *)((long)cvode_mem + 0x1c0);
    *fn = *(N_Vector *)((long)cvode_mem + 0x1d8);
    *gamma = *(sunrealtype *)((long)cvode_mem + 0x528);
    *rl1 = *(sunrealtype *)((long)cvode_mem + 0x520);
    *zn1 = *(N_Vector *)((long)cvode_mem + 0x158);
    *user_data = *(void **)((long)cvode_mem + 0x18);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetNonlinearSystemData(void* cvode_mem, sunrealtype* tcur,
                                N_Vector* ypred, N_Vector* yn, N_Vector* fn,
                                sunrealtype* gamma, sunrealtype* rl1,
                                N_Vector* zn1, void** user_data)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  *tcur      = cv_mem->cv_tn;
  *ypred     = cv_mem->cv_zn[0];
  *yn        = cv_mem->cv_y;
  *fn        = cv_mem->cv_ftemp;
  *gamma     = cv_mem->cv_gamma;
  *rl1       = cv_mem->cv_rl1;
  *zn1       = cv_mem->cv_zn[1];
  *user_data = cv_mem->cv_user_data;

  return (CV_SUCCESS);
}